

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TreeEnsemble.pb.cc
# Opt level: O0

void __thiscall
CoreML::Specification::TreeEnsembleClassifier::SharedCtor(TreeEnsembleClassifier *this)

{
  TreeEnsembleClassifier *this_local;
  
  memset(&this->treeensemble_,0,0xc);
  clear_has_ClassLabels(this);
  this->_cached_size_ = 0;
  return;
}

Assistant:

void TreeEnsembleClassifier::SharedCtor() {
  ::memset(&treeensemble_, 0, reinterpret_cast<char*>(&postevaluationtransform_) -
    reinterpret_cast<char*>(&treeensemble_) + sizeof(postevaluationtransform_));
  clear_has_ClassLabels();
  _cached_size_ = 0;
}